

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_connect(_glist *x,t_floatarg fwhoout,t_floatarg foutno,t_floatarg fwhoin,
                   t_floatarg finno)

{
  uint uVar1;
  t_object *ob1;
  t_object *ob2;
  _class *p_Var2;
  _outconnect *p_Var3;
  undefined4 extraout_var;
  _glist *p_Var4;
  uint uVar5;
  int iVar6;
  uint n1;
  char *pcVar7;
  t_gobj *x_00;
  uint uVar8;
  t_gobj *ptVar9;
  char *pcVar10;
  _gobj *x_01;
  uint n2;
  char *pcVar11;
  uint uVar12;
  char *tags [2];
  char tag [128];
  
  uVar12 = (uint)fwhoout;
  uVar8 = (uint)fwhoin;
  uVar1 = uVar8;
  uVar5 = uVar12;
  if (*(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x70) == x) {
    iVar6 = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x68);
    uVar5 = iVar6 + uVar12;
    uVar1 = iVar6 + uVar8;
  }
  n1 = (uint)foutno;
  n2 = (uint)finno;
  x_00 = x->gl_list;
  iVar6 = uVar5 + 1;
  x_01 = x_00;
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      iVar6 = uVar1 + 1;
      goto LAB_00138e44;
    }
    x_01 = x_01->g_next;
  } while (x_01 != (_gobj *)0x0);
  logpost((void *)0x0,3,"cannot connect non-existing object");
  pcVar7 = x->gl_name->s_name;
  pcVar11 = "???";
  pcVar10 = "???";
  goto LAB_00138efd;
LAB_00138e44:
  iVar6 = iVar6 + -1;
  ptVar9 = x_01;
  if (iVar6 != 0) goto code_r0x00138e48;
  ob1 = pd_checkobject(&x_01->g_pd);
  if ((ob1 == (t_object *)0x0) || (ob2 = pd_checkobject(&x_00->g_pd), ob2 == (t_object *)0x0)) {
    if (x_01 == (t_gobj *)0x0) {
      ptVar9 = x_00;
    }
    pcVar7 = "cannot connect unpatchable object";
  }
  else {
    iVar6 = canvas_isconnected(x,ob1,n1,ob2,n2);
    if (iVar6 == 0) {
      p_Var2 = text_class;
      if ((x_01->g_pd == text_class) && (p_Var2 = x_01->g_pd, (ob1->field_0x2e & 3) == 1)) {
        while (iVar6 = obj_noutlets(ob1), p_Var2 = text_class, iVar6 <= (int)n1) {
          outlet_new(ob1,(t_symbol *)0x0);
        }
      }
      if ((x_00->g_pd == p_Var2) && ((ob2->field_0x2e & 3) == 1)) {
        while (iVar6 = obj_ninlets(ob2), iVar6 <= (int)n2) {
          inlet_new(ob2,(t_pd *)ob2,(t_symbol *)0x0,(t_symbol *)0x0);
        }
      }
      p_Var3 = obj_connect(ob1,n1,ob2,n2);
      if (p_Var3 != (_outconnect *)0x0) {
        iVar6 = glist_isvisible(x);
        if (iVar6 == 0) {
          return;
        }
        if ((x->field_0xe8 & 1) == 0) {
          return;
        }
        tags[0] = tag;
        tags[1] = "cord";
        iVar6 = sprintf(tags[0],"l%lx",p_Var3);
        p_Var4 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar6));
        iVar6 = obj_issignaloutlet(ob1,n1);
        pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var4,"create","line",0,0,0,0,"-width",
                    (ulong)(uint)(x->gl_zoom << (iVar6 != 0)),"-tags",2,tags);
        canvas_fixlinesfor(x,ob1);
        return;
      }
      goto LAB_00138ec7;
    }
    pcVar7 = "io pair already connected";
  }
  goto LAB_00138ec0;
code_r0x00138e48:
  x_00 = x_00->g_next;
  if (x_00 == (_gobj *)0x0) goto code_r0x00138e51;
  goto LAB_00138e44;
code_r0x00138e51:
  pcVar7 = "cannot connect to non-existing object";
  x_00 = (t_gobj *)0x0;
LAB_00138ec0:
  logpost(ptVar9,3,pcVar7);
LAB_00138ec7:
  pcVar7 = x->gl_name->s_name;
  pcVar10 = "???";
  pcVar11 = "???";
  if (x_01 != (t_gobj *)0x0) {
    pcVar11 = class_getname(x_01->g_pd);
  }
  if (x_00 != (t_gobj *)0x0) {
    pcVar10 = class_getname(x_00->g_pd);
  }
LAB_00138efd:
  post("%s %d %d %d %d (%s->%s) connection failed",pcVar7,(ulong)uVar12,(ulong)n1,(ulong)uVar8,
       (ulong)n2,pcVar11,pcVar10);
  return;
}

Assistant:

void canvas_connect(t_canvas *x, t_floatarg fwhoout, t_floatarg foutno,
    t_floatarg fwhoin, t_floatarg finno)
{
    int whoout = fwhoout, outno = foutno, whoin = fwhoin, inno = finno;
    t_gobj *src = 0, *sink = 0;
    t_object *objsrc, *objsink;
    t_outconnect *oc;
    int nin = whoin, nout = whoout;
    if (EDITOR->paste_canvas == x) whoout += EDITOR->paste_onset,
        whoin += EDITOR->paste_onset;
    for (src = x->gl_list; whoout; src = src->g_next, whoout--)
        if (!src->g_next) {
            src = NULL;
            logpost(sink, 3, "cannot connect non-existing object");
            goto bad; /* bug fix thanks to Hannes */
        }
    for (sink = x->gl_list; whoin; sink = sink->g_next, whoin--)
        if (!sink->g_next) {
            sink = NULL;
            logpost(src, 3, "cannot connect to non-existing object");
            goto bad;
        }

        /* check they're both patchable objects */
    if (!(objsrc = pd_checkobject(&src->g_pd)) ||
        !(objsink = pd_checkobject(&sink->g_pd))) {
        logpost(src?src:sink, 3, "cannot connect unpatchable object");
        goto bad;
    }

        /* check if objects are already connected */
    if (canvas_isconnected(x, objsrc, outno, objsink, inno)) {
        logpost(src, 3, "io pair already connected");
        goto bad;
    }

        /* if object creation failed, make dummy inlets or outlets
           as needed */
    if (pd_class(&src->g_pd) == text_class && objsrc->te_type == T_OBJECT)
        while (outno >= obj_noutlets(objsrc))
            outlet_new(objsrc, 0);
    if (pd_class(&sink->g_pd) == text_class && objsink->te_type == T_OBJECT)
        while (inno >= obj_ninlets(objsink))
            inlet_new(objsink, &objsink->ob_pd, 0, 0);

    if (!(oc = obj_connect(objsrc, outno, objsink, inno))) goto bad;
    if (glist_isvisible(x) && x->gl_havewindow)
    {
        char tag[128];
        char*tags[] = {tag, "cord"};
        sprintf(tag, "l%lx", oc);
        pdgui_vmess(0, "crr iiii ri rS",
            glist_getcanvas(x), "create", "line",
            0, 0, 0, 0,
            "-width", (obj_issignaloutlet(objsrc, outno) ? 2 : 1) * x->gl_zoom,
            "-tags", 2, tags);
        canvas_fixlinesfor(x, objsrc);
    }
    return;

bad:
    post("%s %d %d %d %d (%s->%s) connection failed",
        x->gl_name->s_name, nout, outno, nin, inno,
            (src? class_getname(pd_class(&src->g_pd)) : "???"),
            (sink? class_getname(pd_class(&sink->g_pd)) : "???"));
}